

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_v2valid.cpp
# Opt level: O1

bool __thiscall ON_Brep::IsValidForV2(ON_Brep *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ON_BrepLoop *pOVar9;
  double dVar10;
  bool bVar11;
  bool bVar12;
  ON_NurbsCurve *pOVar13;
  ON_NurbsSurface *pOVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_3dPoint local_80;
  ON_3dPoint local_68;
  ON_3dPoint local_48;
  
  bVar11 = IsValidTopology(this,(ON_TextLog *)0x0);
  if (bVar11) {
    lVar16 = (long)(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
    uVar1 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
    uVar2 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
    uVar3 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
            m_count;
    uVar4 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
    uVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
    uVar6 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
    uVar7 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
    if (0 < lVar16) {
      lVar18 = 0;
      do {
        pOVar13 = ON_NurbsCurve::Cast((ON_Object *)
                                      (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar18]);
        if (pOVar13 == (ON_NurbsCurve *)0x0) {
          return false;
        }
        lVar18 = lVar18 + 1;
      } while (lVar16 != lVar18);
    }
    if (0 < (int)uVar1) {
      uVar17 = 0;
      do {
        pOVar13 = ON_NurbsCurve::Cast((ON_Object *)
                                      (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar17]);
        if (pOVar13 == (ON_NurbsCurve *)0x0) {
          return false;
        }
        uVar17 = uVar17 + 1;
      } while (uVar1 != uVar17);
    }
    if (0 < (int)uVar2) {
      uVar17 = 0;
      do {
        pOVar14 = ON_NurbsSurface::Cast
                            ((ON_Object *)(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar17]
                            );
        if (pOVar14 == (ON_NurbsSurface *)0x0) {
          return false;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    if (0 < (int)uVar3) {
      piVar15 = &((this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
                 .m_a)->m_vertex_index;
      uVar17 = 0;
      do {
        if (uVar17 != (uint)*piVar15) {
          return false;
        }
        uVar17 = uVar17 + 1;
        piVar15 = piVar15 + 0x16;
      } while (uVar3 != uVar17);
    }
    if (0 < (int)uVar5) {
      piVar15 = &((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
                 )->m_face_index;
      uVar17 = 0;
      do {
        if (uVar17 != (uint)*piVar15) {
          return false;
        }
        uVar17 = uVar17 + 1;
        piVar15 = piVar15 + 0x36;
      } while (uVar5 != uVar17);
    }
    if (0 < (int)uVar7) {
      lVar16 = 0;
      do {
        bVar12 = IsValidForV2(this,(ON_BrepTrim *)
                                   ((long)&(((ON_CurveProxy *)
                                            (&(((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                                super_ON_ClassArray<ON_BrepTrim>.m_a)->
                                              super_ON_CurveProxy).m_real_curve_domain + -2))->
                                           super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                           _vptr_ON_Object + lVar16));
        if (!bVar12) {
          return false;
        }
        lVar16 = lVar16 + 0xe8;
      } while ((ulong)uVar7 * 0xe8 - lVar16 != 0);
    }
    if (0 < (int)uVar4) {
      lVar16 = 0;
      do {
        bVar12 = IsValidForV2(this,(ON_BrepEdge *)
                                   ((long)&(((ON_CurveProxy *)
                                            (&(((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                                super_ON_ClassArray<ON_BrepEdge>.m_a)->
                                              super_ON_CurveProxy).m_real_curve_domain + -2))->
                                           super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                           _vptr_ON_Object + lVar16));
        if (!bVar12) {
          return false;
        }
        lVar16 = lVar16 + 0x88;
      } while ((ulong)uVar4 * 0x88 != lVar16);
    }
    if (0 < (int)uVar6) {
      uVar17 = 0;
      do {
        pOVar9 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
        if (pOVar9[uVar17].m_loop_index == -1) {
          return false;
        }
        uVar1 = pOVar9[uVar17].m_ti.m_count;
        uVar20 = 0;
        if (0 < (int)uVar1) {
          uVar20 = (ulong)uVar1;
        }
        uVar19 = 0;
        while (uVar20 != uVar19) {
          piVar15 = pOVar9[uVar17].m_ti.m_a;
          iVar8 = piVar15[uVar19];
          if ((long)iVar8 < 0) {
            return false;
          }
          if ((int)uVar7 <= iVar8) {
            return false;
          }
          uVar2 = piVar15[(long)((int)uVar19 + 1) % (long)(int)uVar1 & 0xffffffff];
          if ((int)uVar2 < 0) {
            return false;
          }
          if ((int)uVar7 <= (int)uVar2) {
            return false;
          }
          ON_Curve::PointAtEnd
                    (&local_80,
                     (ON_Curve *)
                     ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                      .m_a + iVar8));
          local_48.z = local_80.z;
          local_48.x = local_80.x;
          local_48.y = local_80.y;
          ON_Curve::PointAtStart
                    (&local_80,
                     (ON_Curve *)
                     ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                      .m_a + uVar2));
          local_68.z = local_80.z;
          local_68.x = local_80.x;
          local_68.y = local_80.y;
          dVar10 = ON_3dPoint::DistanceTo(&local_48,&local_68);
          uVar19 = uVar19 + 1;
          if (2.3283064365386963e-10 < dVar10) {
            return false;
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar6);
    }
  }
  return bVar11;
}

Assistant:

bool ON_Brep::IsValidForV2() const
{
  bool rc = IsValidTopology()?true:false;
  if ( rc )
  {
    int c2i, c3i, si, ti, li, ei, vi, fi, next_ti, lti, next_lti, loop_trim_count;
    ON_3dPoint P0, P1;

    const int c2_count = m_C2.Count();
    const int c3_count = m_C3.Count();
    const int s_count  = m_S.Count();
    const int vertex_count = m_V.Count();
    const int edge_count = m_E.Count();
    const int face_count = m_F.Count();
    const int loop_count = m_L.Count();
    const int trim_count = m_T.Count();

    for ( c2i = 0; c2i < c2_count; c2i++ )
    {
      // v2 3dm files expect NURBS curves
      if ( !ON_NurbsCurve::Cast(m_C2[c2i]) )
        return false;
    }

    for ( c3i = 0; c3i < c3_count; c3i++ )
    {
      // v2 3dm files expect NURBS curves
      if ( !ON_NurbsCurve::Cast(m_C3[c3i]) )
        return false;
    }

    for ( si = 0; si < s_count; si++ )
    {
      // v2 3dm files expect NURBS surfaces
      if ( !ON_NurbsSurface::Cast(m_S[si]) )
        return false;
    }

    for ( vi = 0; vi < vertex_count; vi++ )
    {
      const ON_BrepVertex& vertex = m_V[vi];
      if ( vertex.m_vertex_index != vi )
        return false;
    }

    for ( fi = 0; fi < face_count; fi++ )
    {
      const ON_BrepFace& face = m_F[fi];
      if ( face.m_face_index != fi )
        return false;
    }

    for ( ti = 0; ti < trim_count; ti++ )
    {
      if ( !IsValidForV2( m_T[ti] ) )
        return false;
    }

    for ( ei = 0; ei < edge_count; ei++ )
    {
      if ( !IsValidForV2(m_E[ei]) )
        return false;
    }

    for ( li = 0; li < loop_count; li++ )
    {
      const ON_BrepLoop& loop = m_L[li];
      if ( loop.m_loop_index == -1 )
        return false;
      loop_trim_count = loop.m_ti.Count();
      for ( lti = 0; lti < loop_trim_count; lti++ )
      {
        next_lti = (lti+1)%loop_trim_count;
        ti = loop.m_ti[lti];
        next_ti = loop.m_ti[next_lti];
        if ( ti < 0 || ti >= trim_count )
          return false;
        if ( next_ti < 0 || next_ti >= trim_count )
          return false;
        P0 = m_T[ti].PointAtEnd();
        P1 = m_T[next_ti].PointAtStart();
        if ( P0.DistanceTo(P1) > ON_ZERO_TOLERANCE )
          return false;
      }
    }
  }

  return rc;
}